

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m_argv.cpp
# Opt level: O2

char * __thiscall DArgs::CheckValue(DArgs *this,char *check)

{
  char cVar1;
  char *pcVar2;
  uint uVar3;
  char *pcVar4;
  
  uVar3 = CheckParm(this,check,1);
  if (((int)uVar3 < 1) || ((int)((this->Argv).Count - 1) <= (int)uVar3)) {
    pcVar4 = (char *)0x0;
  }
  else {
    pcVar2 = (this->Argv).Array[(ulong)uVar3 + 1].Chars;
    cVar1 = *pcVar2;
    pcVar4 = (char *)0x0;
    if ((cVar1 != '+') && (cVar1 != '-')) {
      pcVar4 = pcVar2;
    }
  }
  return pcVar4;
}

Assistant:

const char *DArgs::CheckValue(const char *check) const
{
	int i = CheckParm(check);

	if (i > 0 && i < (int)Argv.Size() - 1)
	{
		i++;
		return Argv[i][0] != '+' && Argv[i][0] != '-' ? Argv[i].GetChars() : NULL;
	}
	else
	{
		return NULL;
	}
}